

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

void ddb_h2(Integer ndims,Integer *ardims,Integer npes,double threshold,Integer bias,Integer *blk,
           Integer *pedims)

{
  long lVar1;
  Integer *ardims_00;
  void *__ptr;
  double in_RCX;
  Integer *in_RDX;
  long lVar2;
  Integer *in_RSI;
  size_t in_RDI;
  Integer *in_R8;
  Integer *in_R9;
  double in_XMM0_Qa;
  double dVar3;
  long ilook;
  long istep;
  long istart;
  double ub;
  double w;
  double q;
  long p0;
  long npdivs;
  long *pdivs;
  Integer *tard;
  long k;
  long j;
  long i;
  long h;
  Integer in_stack_000000e8;
  char *in_stack_000000f0;
  double local_b8;
  double local_b0;
  long local_a0;
  long local_98;
  double local_80;
  size_t local_70;
  size_t local_58;
  size_t local_50;
  long local_48;
  size_t local_40;
  
  ardims_00 = (Integer *)calloc(in_RDI,8);
  if (ardims_00 == (Integer *)0x0) {
    fprintf(_stderr,"%s: %s\n","ddb_h2","memory allocation failed");
    for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
      in_R8[local_48] = 0;
    }
  }
  else {
    for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
      if (in_R8[local_48] < 1) {
        in_R8[local_48] = 1;
      }
    }
    for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
      ardims_00[local_48] = (in_RSI[local_48] + in_R8[local_48] + -1) / in_R8[local_48];
    }
    for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
      if (ardims_00[local_48] < 1) {
        ardims_00[local_48] = 1;
        in_R8[local_48] = in_RSI[local_48];
      }
    }
    local_70 = 1;
    for (local_48 = 2; local_48 <= (long)in_RDX; local_48 = local_48 + 1) {
      if ((long)in_RDX % local_48 == 0) {
        local_70 = local_70 + 1;
      }
    }
    __ptr = calloc(local_70,8);
    if (__ptr == (void *)0x0) {
      fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
      for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
        in_R8[local_48] = 0;
      }
      free(ardims_00);
    }
    else {
      local_50 = 0;
      for (local_48 = 1; local_48 <= (long)in_RDX; local_48 = local_48 + 1) {
        if ((long)in_RDX % local_48 == 0) {
          *(long *)((long)__ptr + local_50 * 8) = local_48;
          local_50 = local_50 + 1;
        }
      }
      if (1 < (long)local_70) {
        local_58 = 1;
        do {
          local_50 = local_58 + 1;
          local_40 = local_50;
          for (; (long)local_50 < (long)local_70; local_50 = local_50 + 1) {
            if (*(long *)((long)__ptr + local_50 * 8) % *(long *)((long)__ptr + local_58 * 8) == 0)
            {
              *(long *)((long)__ptr + local_40 * 8) =
                   *(long *)((long)__ptr + local_50 * 8) / *(long *)((long)__ptr + local_58 * 8);
              local_40 = local_40 + 1;
            }
          }
          local_70 = local_40;
          local_58 = local_58 + 1;
        } while ((long)local_58 < (long)local_40);
      }
      local_a0 = 1;
      local_98 = 0;
      if (0 < (long)in_RCX) {
        local_a0 = -1;
        local_98 = in_RDI - 1;
      }
      for (local_50 = 0; (long)local_50 < (long)in_RDI; local_50 = local_50 + 1) {
        in_R9[local_50] = 1;
      }
      while (local_58 = local_70 - 1, 0 < (long)local_58) {
        lVar1 = *(long *)((long)__ptr + local_58 * 8);
        local_40 = local_98;
        if (ardims_00[local_98] < lVar1 * in_R9[local_98]) {
          local_b0 = 1.1;
        }
        else {
          local_b0 = (double)(ardims_00[local_98] % (lVar1 * in_R9[local_98])) /
                     (double)ardims_00[local_98];
        }
        local_80 = local_b0;
        for (local_50 = 1; (long)local_50 < (long)in_RDI; local_50 = local_50 + 1) {
          lVar2 = (long)(local_98 + local_a0 * local_50) % (long)in_RDI;
          if (ardims_00[lVar2] < lVar1 * in_R9[lVar2]) {
            local_b8 = 1.1;
          }
          else {
            local_b8 = (double)(ardims_00[lVar2] % (lVar1 * in_R9[lVar2])) /
                       (double)ardims_00[lVar2];
          }
          if (local_b8 < local_80) {
            local_80 = local_b8;
            local_40 = lVar2;
          }
        }
        in_R9[local_40] = lVar1 * in_R9[local_40];
        local_70 = local_58;
        if (in_RCX == 0.0) {
          local_98 = (local_98 + 1) % (long)in_RDI;
        }
      }
      free(__ptr);
      dVar3 = dd_ev(in_RDI,ardims_00,in_R9);
      if (dVar3 < in_XMM0_Qa) {
        ddb_ex((long)in_RSI,in_RDX,(long)in_XMM0_Qa,in_RCX,in_R8,in_R9);
      }
      dd_su(in_RDI,in_RSI,in_R9,in_R8);
      for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
        if (in_R9[local_48] < 1) {
          pnga_error(in_stack_000000f0,in_stack_000000e8);
        }
        else {
          in_R8[local_48] = (ardims_00[local_48] + in_R9[local_48] + -1) / in_R9[local_48];
        }
      }
      free(ardims_00);
    }
  }
  return;
}

Assistant:

void ddb_h2(Integer ndims, Integer ardims[], Integer npes, double threshold, Integer bias,
            Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      Integer *tard;
      long * pdivs;
      long npdivs;
      long p0;
      double q, w;
      double ub;
      long istart, istep, ilook;

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h2",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;

      for(i=0;i<ndims;i++) tard[i] = (ardims[i]+ blk[i]-1)/blk[i]; /* JM */
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];
      }

      /*- Allocate storage to old all divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }
      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Find all prime divisors of npes (with repetitions) -*/
      if(npdivs>1) {
         k = 1;
         do {
            h = k+1;
            for(j=h;j<npdivs;j++)
            if(pdivs[j]%pdivs[k]==0)
               pdivs[h++] = pdivs[j]/pdivs[k];
            npdivs = h;
            k = k+1;
         } while(k<npdivs);
      }

      /*- Set istart and istep -*/
      istep = 1;
      istart = 0;
      if(bias>0) {
          istep = -1;
          istart = ndims-1;
      }
      /*- Set pedims -*/
      for(j=0;j<ndims;j++) pedims[j] = 1.0;
      for(k=npdivs-1;k>=1;k--){
         p0 = pdivs[k]; h = istart;
         q = (tard[istart]<p0*pedims[istart]) ? 1.1 :
             (tard[istart]%(p0*pedims[istart]))/(double) tard[istart];
         for(j=1;j<ndims;j++){
            ilook = (istart+istep*j)%ndims;
            w = (tard[ilook]<p0*pedims[ilook]) ? 1.1 :
                (tard[ilook]%(p0*pedims[ilook]))/(double) tard[ilook];
            if(w<q) { q = w; h = ilook; }
         }
         pedims[h] *= p0;
         if(bias==0) istart = (istart+1)%ndims;
      }
      free(pdivs);

      ub = dd_ev(ndims,tard,pedims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(ub<threshold) {
         ddb_ex(ndims, tard, npes, threshold, blk, pedims);
      }

      dd_su(ndims,ardims,pedims,blk);

      for(i=0;i<ndims;i++)
          if(pedims[i]>0){
             blk[i] = (tard[i]+pedims[i]-1)/pedims[i];
          } else {
             pnga_error("process dimension is zero: ddb_h2",0);
          }

      free(tard);
      return;
      }